

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::joinArrays(Interpreter *this)

{
  value_type pHVar1;
  Frame *pFVar2;
  HeapEntity *this_00;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *v;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *pvVar3;
  const_reference ppHVar4;
  Interpreter *in_RDI;
  Value VVar5;
  HeapThunk *th;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elements;
  Frame *f;
  BindingFrame *in_stack_00000088;
  uint in_stack_00000094;
  HeapObject *in_stack_00000098;
  HeapEntity *in_stack_000000a0;
  LocationRange *in_stack_000000a8;
  Stack *in_stack_000000b0;
  Value *in_stack_00000238;
  uint in_stack_00000244;
  Value *in_stack_00000248;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_00000250;
  bool *in_stack_00000258;
  Interpreter *in_stack_00000260;
  undefined4 uStack_34;
  
  pFVar2 = Stack::top((Stack *)0x2437fc);
  this_00 = (pFVar2->val2).v.h + 1;
  while( true ) {
    v = (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
         *)(ulong)pFVar2->elementId;
    pvVar3 = (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              *)std::
                vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                ::size((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)this_00);
    if (pvVar3 <= v) {
      VVar5 = makeArray(in_RDI,v);
      *(ulong *)&in_RDI->scratch = CONCAT44(uStack_34,VVar5.t);
      (in_RDI->scratch).v = VVar5.v;
      return (AST *)0x0;
    }
    ppHVar4 = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                            *)this_00,(ulong)pFVar2->elementId);
    pHVar1 = *ppHVar4;
    if (((pHVar1->super_HeapEntity).field_0xa & 1) == 0) break;
    joinArray(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
              in_stack_00000244,in_stack_00000238);
    pFVar2->elementId = pFVar2->elementId + 1;
  }
  Stack::newCall(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                 in_stack_00000094,in_stack_00000088);
  return pHVar1->body;
}

Assistant:

const AST *joinArrays(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val2.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                joinArray(f.first, f.thunks, f.val, f.elementId, th->content);
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeArray(f.thunks);
        return nullptr;
    }